

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.cpp
# Opt level: O0

EventDefinition * findEventByName(String *a)

{
  bool bVar1;
  reference ppEVar2;
  String local_a8;
  String local_88;
  EventDefinition *local_68;
  EventDefinition *e;
  Iterator __end1;
  Iterator __begin1;
  List<EventDefinition_*> *__range1;
  String *a_local;
  
  List<EventDefinition_*>::begin((Iterator *)&__end1._M_node,&Events);
  List<EventDefinition_*>::end((Iterator *)&e,&Events);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&e);
    if (!bVar1) {
      return (EventDefinition *)0x0;
    }
    ppEVar2 = std::_Deque_iterator<EventDefinition_*,_EventDefinition_*&,_EventDefinition_**>::
              operator*((_Deque_iterator<EventDefinition_*,_EventDefinition_*&,_EventDefinition_**>
                         *)&__end1._M_node);
    local_68 = *ppEVar2;
    String::toUppercase(&local_88,a);
    String::toUppercase(&local_a8,&local_68->name);
    bVar1 = String::operator==(&local_88,&local_a8);
    String::~String(&local_a8);
    String::~String(&local_88);
    if (bVar1) break;
    std::_Deque_iterator<EventDefinition_*,_EventDefinition_*&,_EventDefinition_**>::operator++
              ((_Deque_iterator<EventDefinition_*,_EventDefinition_*&,_EventDefinition_**> *)
               &__end1._M_node);
  }
  return local_68;
}

Assistant:

EventDefinition* findEventByName (String a)
{
	for (EventDefinition* e : Events)
	{
		if (a.toUppercase() == e->name.toUppercase())
			return e;
	}

	return null;
}